

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void * __thiscall kj::Arena::allocateBytesInternal(Arena *this,size_t amount,uint alignment)

{
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_long>_> WVar1;
  size_t sVar2;
  ChunkHeader *pCVar3;
  byte *pbVar4;
  ChunkHeader *newChunk;
  byte *bytes;
  byte *local_38;
  byte *alignedPos;
  ChunkHeader *chunk;
  size_t sStack_20;
  uint alignment_local;
  size_t amount_local;
  Arena *this_local;
  
  chunk._4_4_ = alignment;
  sStack_20 = amount;
  amount_local = (size_t)this;
  if (this->currentChunk != (ChunkHeader *)0x0) {
    alignedPos = (byte *)this->currentChunk;
    local_38 = anon_unknown_53::alignTo(((ChunkHeader *)alignedPos)->pos,alignment);
    if (local_38 + (sStack_20 - *(long *)(alignedPos + 8)) <=
        (byte *)(*(long *)(alignedPos + 0x10) - *(long *)(alignedPos + 8))) {
      *(byte **)(alignedPos + 8) = local_38 + sStack_20;
      return local_38;
    }
  }
  bytes = (byte *)0x8;
  WVar1 = max<unsigned_int&,unsigned_long>((uint *)((long)&chunk + 4),(unsigned_long *)&bytes);
  chunk._4_4_ = (uint)WVar1;
  sVar2 = anon_unknown_53::alignTo(0x18,chunk._4_4_);
  sStack_20 = sVar2 + sStack_20;
  while (this->nextChunkSize < sStack_20) {
    this->nextChunkSize = this->nextChunkSize << 1;
  }
  pCVar3 = (ChunkHeader *)operator_new(this->nextChunkSize);
  pCVar3->next = this->chunkList;
  pCVar3->pos = (byte *)((long)&pCVar3->next + sStack_20);
  pCVar3->end = (byte *)((long)&pCVar3->next + this->nextChunkSize);
  this->currentChunk = pCVar3;
  this->chunkList = pCVar3;
  this->nextChunkSize = this->nextChunkSize << 1;
  pbVar4 = anon_unknown_53::alignTo((byte *)(pCVar3 + 1),chunk._4_4_);
  return pbVar4;
}

Assistant:

void* Arena::allocateBytesInternal(size_t amount, uint alignment) {
  if (currentChunk != nullptr) {
    ChunkHeader* chunk = currentChunk;
    byte* alignedPos = alignTo(chunk->pos, alignment);

    // Careful about overflow here.
    if (amount + (alignedPos - chunk->pos) <= chunk->end - chunk->pos) {
      // There's enough space in this chunk.
      chunk->pos = alignedPos + amount;
      return alignedPos;
    }
  }

  // Not enough space in the current chunk.  Allocate a new one.

  // We need to allocate at least enough space for the ChunkHeader and the requested allocation.

  // If the alignment is less than that of the chunk header, we'll need to increase it.
  alignment = kj::max(alignment, alignof(ChunkHeader));

  // If the ChunkHeader size does not match the alignment, we'll need to pad it up.
  amount += alignTo(sizeof(ChunkHeader), alignment);

  // Make sure we're going to allocate enough space.
  while (nextChunkSize < amount) {
    nextChunkSize *= 2;
  }

  // Allocate.
  byte* bytes = reinterpret_cast<byte*>(operator new(nextChunkSize));

  // Set up the ChunkHeader at the beginning of the allocation.
  ChunkHeader* newChunk = reinterpret_cast<ChunkHeader*>(bytes);
  newChunk->next = chunkList;
  newChunk->pos = bytes + amount;
  newChunk->end = bytes + nextChunkSize;
  currentChunk = newChunk;
  chunkList = newChunk;
  nextChunkSize *= 2;

  // Move past the ChunkHeader to find the position of the allocated object.
  return alignTo(bytes + sizeof(ChunkHeader), alignment);
}